

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar10 = field_number << 3;
  *ptr = (byte)uVar10 + 2;
  if (uVar10 < 0x80) {
    pbVar7 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar10 | 0x82;
    ptr[1] = (byte)(uVar10 >> 7);
    pbVar7 = ptr + 2;
    if (0x3fff < uVar10) {
      uVar8 = (uint)ptr[1];
      uVar10 = uVar10 >> 7;
      do {
        pbVar7[-1] = (byte)uVar8 | 0x80;
        uVar8 = uVar10 >> 7;
        *pbVar7 = (byte)uVar8;
        pbVar7 = pbVar7 + 1;
        bVar2 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar2);
    }
  }
  uVar10 = (uint)key->_M_string_length;
  uVar8 = uVar10 | 1;
  iVar3 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  uVar8 = (uint)value->_M_string_length;
  uVar9 = uVar8 | 1;
  iVar4 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  uVar10 = (iVar4 * 9 + 0x49U >> 6) + uVar10 + uVar8 + (iVar3 * 9 + 0x49U >> 6) + 2;
  *pbVar7 = (byte)uVar10;
  if (uVar10 < 0x80) {
    pbVar5 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)uVar10 | 0x80;
    pbVar7[1] = (byte)(uVar10 >> 7);
    pbVar5 = pbVar7 + 2;
    if (0x3fff < uVar10) {
      uVar8 = (uint)pbVar7[1];
      uVar10 = uVar10 >> 7;
      do {
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar8 = uVar10 >> 7;
        *pbVar5 = (byte)uVar8;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar2);
    }
  }
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  sVar1 = key->_M_string_length;
  if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)pbVar5)))) {
    *pbVar5 = 10;
    pbVar5[1] = (byte)sVar1;
    memcpy(pbVar5 + 2,(key->_M_dataplus)._M_p,sVar1);
    pbVar5 = pbVar5 + sVar1 + 2;
  }
  else {
    pbVar5 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,key,pbVar5);
  }
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  sVar1 = value->_M_string_length;
  if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)pbVar5)))) {
    *pbVar5 = 0x12;
    pbVar5[1] = (byte)sVar1;
    memcpy(pbVar5 + 2,(value->_M_dataplus)._M_p,sVar1);
    return pbVar5 + sVar1 + 2;
  }
  puVar6 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,value,pbVar5);
  return puVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }